

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabInstanceNext(Fts5VocabCursor *pCsr)

{
  int iVar1;
  Fts5IndexIter *pFVar2;
  int iVar3;
  bool bVar4;
  int *po;
  i64 *pp;
  Fts5IndexIter *pIter;
  int rc;
  int eDetail;
  Fts5VocabCursor *pCsr_local;
  
  iVar1 = pCsr->pFts5->pConfig->eDetail;
  pIter._0_4_ = 0;
  pFVar2 = pCsr->pIter;
  do {
    bVar4 = true;
    if (iVar1 != 1) {
      iVar3 = sqlite3Fts5PoslistNext64(pFVar2->pData,pFVar2->nData,&pCsr->iInstOff,&pCsr->iInstPos);
      bVar4 = iVar3 != 0;
    }
    if (!bVar4) {
      return (int)pIter;
    }
    pCsr->iInstPos = 0;
    pCsr->iInstOff = 0;
    pIter._0_4_ = sqlite3Fts5IterNextScan(pCsr->pIter);
    if ((int)pIter == 0) {
      pIter._0_4_ = fts5VocabInstanceNewTerm(pCsr);
      if (pCsr->bEof != 0) {
        return (int)pIter;
      }
      if (iVar1 == 1) {
        return (int)pIter;
      }
    }
    if ((int)pIter != 0) {
      pCsr->bEof = 1;
      return (int)pIter;
    }
  } while( true );
}

Assistant:

static int fts5VocabInstanceNext(Fts5VocabCursor *pCsr){
  int eDetail = pCsr->pFts5->pConfig->eDetail;
  int rc = SQLITE_OK;
  Fts5IndexIter *pIter = pCsr->pIter;
  i64 *pp = &pCsr->iInstPos;
  int *po = &pCsr->iInstOff;
  
  assert( sqlite3Fts5IterEof(pIter)==0 );
  assert( pCsr->bEof==0 );
  while( eDetail==FTS5_DETAIL_NONE
      || sqlite3Fts5PoslistNext64(pIter->pData, pIter->nData, po, pp) 
  ){
    pCsr->iInstPos = 0;
    pCsr->iInstOff = 0;

    rc = sqlite3Fts5IterNextScan(pCsr->pIter);
    if( rc==SQLITE_OK ){
      rc = fts5VocabInstanceNewTerm(pCsr);
      if( pCsr->bEof || eDetail==FTS5_DETAIL_NONE ) break;
    }
    if( rc ){
      pCsr->bEof = 1;
      break;
    }
  }

  return rc;
}